

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cave-view.c
# Opt level: O0

void add_light(chunk_conflict *c,player *p,loc sgrid,wchar_t radius,wchar_t inten)

{
  _Bool _Var1;
  wchar_t wVar2;
  loc grid2;
  loc_conflict grid_00;
  wchar_t dist;
  wchar_t local_38;
  wchar_t wStack_34;
  loc grid;
  wchar_t x;
  wchar_t y;
  wchar_t inten_local;
  wchar_t radius_local;
  player *p_local;
  chunk_conflict *c_local;
  loc sgrid_local;
  
  for (grid.y = -radius; grid.y <= radius; grid.y = grid.y + 1) {
    for (grid.x = -radius; grid.x <= radius; grid.x = grid.x + 1) {
      grid2 = loc(grid.x,grid.y);
      grid_00 = (loc_conflict)loc_sum(sgrid,grid2);
      wVar2 = distance(sgrid,(loc)grid_00);
      _Var1 = square_in_bounds((chunk *)c,grid_00);
      if ((((_Var1) && (wVar2 <= radius)) && (_Var1 = los(c,sgrid,(loc)grid_00), _Var1)) &&
         ((_Var1 = square_allowslos((chunk *)c,grid_00), _Var1 ||
          (_Var1 = source_can_light_wall(c,p,sgrid,(loc)grid_00), _Var1)))) {
        local_38 = grid_00.x;
        wStack_34 = grid_00.y;
        if (inten < L'\x01') {
          c->squares[wStack_34][local_38].light =
               inten + wVar2 + c->squares[wStack_34][local_38].light;
        }
        else {
          c->squares[wStack_34][local_38].light =
               (inten - wVar2) + c->squares[wStack_34][local_38].light;
        }
      }
    }
  }
  return;
}

Assistant:

static void add_light(struct chunk *c, struct player *p, struct loc sgrid,
		int radius, int inten)
{
	int y;

	for (y = -radius; y <= radius; y++) {
		int x;

		for (x = -radius; x <= radius; x++) {
			struct loc grid = loc_sum(sgrid, loc(x, y));
			int dist = distance(sgrid, grid);
			if (!square_in_bounds(c, grid)) continue;
			if (dist > radius) continue;
			/* Don't propagate the light through walls. */
			if (!los(c, sgrid, grid)) continue;
			/*
			 * Only light a wall if the face lit is possibly visible
			 * to the player.
			 */
			if (!square_allowslos(c, grid) && !source_can_light_wall(c,
					p, sgrid, grid)) continue;
			/* Adjust the light level */
			if (inten > 0) {
				/* Light getting less further away */
				c->squares[grid.y][grid.x].light +=
					inten - dist;
			} else {
				/* Light getting greater further away */
				c->squares[grid.y][grid.x].light +=
					inten + dist;
			}
		}
	}
}